

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O2

ggml_tensor * __thiscall
llm_build_mamba::build_mamba_layer
          (llm_build_mamba *this,ggml_cgraph *gf,ggml_tensor *cur,ggml_tensor *state_copy,
          ggml_tensor *state_mask,llama_ubatch *ubatch,int il)

{
  float fVar1;
  bool bVar2;
  uint n_seqs;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  llama_hparams *this_00;
  llama_memory_i *plVar6;
  ggml_tensor *s;
  ggml_context *pgVar7;
  int64_t iVar8;
  int64_t iVar9;
  ggml_context *pgVar10;
  uint32_t uVar11;
  ulong uVar12;
  ggml_tensor *pgVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  long lVar17;
  undefined8 uVar18;
  long lVar19;
  ggml_tensor *pgVar20;
  ggml_tensor *cur_00;
  undefined8 uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  char *pcVar25;
  long lVar26;
  ulong uVar27;
  long lVar28;
  size_t sVar29;
  size_t sVar30;
  
  n_seqs = ubatch->n_seqs;
  uVar27 = (ulong)n_seqs;
  if (uVar27 == 0) {
    pcVar25 = "n_seqs != 0";
    uVar14 = 0x21e7;
  }
  else if (ubatch->equal_seqs == false) {
    pcVar25 = "ubatch.equal_seqs";
    uVar14 = 0x21e8;
  }
  else {
    uVar12 = (ulong)ubatch->n_seq_tokens;
    uVar3 = ubatch->n_tokens;
    if (uVar12 * uVar27 - (ulong)uVar3 == 0) {
      this_00 = (this->super_llm_graph_context).hparams;
      plVar6 = (this->super_llm_graph_context).memory;
      uVar4 = *(uint *)&plVar6[0xd]._vptr_llama_memory_i;
      uVar5 = this_00->ssm_d_conv;
      uVar22 = (ulong)this_00->ssm_d_inner;
      uVar23 = (ulong)this_00->ssm_d_state;
      uVar24 = (ulong)this_00->ssm_dt_rank;
      bVar2 = this_00->ssm_dt_b_c_rms;
      fVar1 = this_00->f_norm_rms_eps;
      lVar26 = (long)il;
      pgVar20 = (ggml_tensor *)plVar6[0x12]._vptr_llama_memory_i[lVar26];
      s = (ggml_tensor *)plVar6[0x15]._vptr_llama_memory_i[lVar26];
      uVar11 = llama_hparams::n_embd_k_s(this_00);
      pgVar13 = llm_graph_context::build_copy_mask_state
                          (&this->super_llm_graph_context,gf,pgVar20,state_copy,state_mask,uVar11,
                           n_seqs);
      lVar28 = (ulong)uVar5 - 1;
      uVar14 = ggml_reshape_3d((this->super_llm_graph_context).ctx0,pgVar13,lVar28,uVar22,uVar27);
      uVar11 = llama_hparams::n_embd_v_s((this->super_llm_graph_context).hparams);
      pgVar13 = llm_graph_context::build_copy_mask_state
                          (&this->super_llm_graph_context,gf,s,state_copy,state_mask,uVar11,n_seqs);
      uVar15 = ggml_reshape_3d((this->super_llm_graph_context).ctx0,pgVar13,uVar23,uVar22,uVar27);
      pgVar13 = (ggml_tensor *)
                ggml_reshape_3d((this->super_llm_graph_context).ctx0,cur,cur->ne[0],uVar12,uVar27);
      pgVar13 = llm_graph_context::build_lora_mm
                          (&this->super_llm_graph_context,
                           (this->model->layers).
                           super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar26].ssm_in,pgVar13);
      uVar16 = ggml_view_3d((this->super_llm_graph_context).ctx0,pgVar13,uVar22,pgVar13->ne[1],
                            pgVar13->ne[2],pgVar13->nb[1]);
      pgVar7 = (this->super_llm_graph_context).ctx0;
      iVar8 = pgVar13->ne[1];
      iVar9 = pgVar13->ne[2];
      sVar30 = pgVar13->nb[1];
      sVar29 = pgVar13->nb[2];
      lVar17 = ggml_element_size(pgVar13);
      lVar17 = lVar17 * uVar22;
      uVar18 = ggml_view_3d(pgVar7,pgVar13,uVar22,iVar8,iVar9,sVar30);
      pgVar7 = (this->super_llm_graph_context).ctx0;
      uVar16 = ggml_transpose(pgVar7,uVar16,lVar17,sVar29);
      lVar17 = ggml_concat(pgVar7,uVar14,uVar16,0);
      uVar14 = ggml_view_3d((this->super_llm_graph_context).ctx0,lVar17,lVar28,uVar22,uVar27,
                            *(undefined8 *)(lVar17 + 0x38));
      pgVar7 = (this->super_llm_graph_context).ctx0;
      lVar19 = ggml_element_size(pgVar20);
      uVar16 = ggml_view_1d(pgVar7,pgVar20,lVar28 * uVar22 * uVar27,
                            lVar28 * uVar22 * (ulong)uVar4 * lVar19);
      uVar14 = ggml_cpy(pgVar7,uVar14,uVar16);
      ggml_build_forward_expand(gf,uVar14);
      uVar14 = ggml_ssm_conv((this->super_llm_graph_context).ctx0,lVar17,
                             (this->model->layers).
                             super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar26].ssm_conv1d);
      uVar14 = ggml_add((this->super_llm_graph_context).ctx0,uVar14,
                        (this->model->layers).
                        super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar26].ssm_conv1d_b);
      pgVar20 = (ggml_tensor *)ggml_silu((this->super_llm_graph_context).ctx0,uVar14);
      pgVar13 = llm_graph_context::build_lora_mm
                          (&this->super_llm_graph_context,
                           (this->model->layers).
                           super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar26].ssm_x,pgVar20);
      cur_00 = (ggml_tensor *)
               ggml_view_3d((this->super_llm_graph_context).ctx0,pgVar13,uVar24,uVar12,uVar27,
                            pgVar13->nb[1]);
      pgVar7 = (this->super_llm_graph_context).ctx0;
      sVar30 = pgVar13->nb[1];
      sVar29 = pgVar13->nb[2];
      lVar17 = ggml_element_size(pgVar13);
      uVar14 = ggml_view_3d(pgVar7,pgVar13,uVar23,uVar12,uVar27,sVar30,sVar29,lVar17 * uVar24);
      pgVar7 = (this->super_llm_graph_context).ctx0;
      sVar30 = pgVar13->nb[1];
      sVar29 = pgVar13->nb[2];
      lVar17 = ggml_element_size(pgVar13);
      lVar17 = (uVar24 + uVar23) * lVar17;
      uVar16 = ggml_view_3d(pgVar7,pgVar13,uVar23,uVar12,uVar27,sVar30);
      if (bVar2 != false) {
        cur_00 = (ggml_tensor *)
                 ggml_rms_norm(fVar1,(this->super_llm_graph_context).ctx0,cur_00,lVar17,sVar29);
        uVar14 = ggml_rms_norm(fVar1,(this->super_llm_graph_context).ctx0,uVar14);
        uVar16 = ggml_rms_norm(fVar1,(this->super_llm_graph_context).ctx0,uVar16);
      }
      pgVar13 = llm_graph_context::build_lora_mm
                          (&this->super_llm_graph_context,
                           (this->model->layers).
                           super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar26].ssm_dt,cur_00);
      uVar21 = ggml_add((this->super_llm_graph_context).ctx0,pgVar13,
                        (this->model->layers).
                        super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar26].ssm_dt_b);
      uVar14 = ggml_ssm_scan((this->super_llm_graph_context).ctx0,uVar15,pgVar20,uVar21,
                             (this->model->layers).
                             super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar26].ssm_a,uVar14,uVar16);
      pgVar7 = (this->super_llm_graph_context).ctx0;
      lVar19 = uVar23 * uVar22 * uVar27;
      uVar15 = ggml_view_1d(pgVar7,uVar14,lVar19,pgVar20->nb[3]);
      pgVar10 = (this->super_llm_graph_context).ctx0;
      lVar17 = ggml_element_size(s);
      uVar16 = ggml_view_1d(pgVar10,s,lVar19,uVar4 * uVar22 * uVar23 * lVar17);
      uVar15 = ggml_cpy(pgVar7,uVar15,uVar16);
      ggml_build_forward_expand(gf,uVar15);
      sVar30 = pgVar20->nb[2];
      uVar14 = ggml_view_3d((this->super_llm_graph_context).ctx0,uVar14,uVar22,uVar12,uVar27,
                            pgVar20->nb[1],sVar30,0);
      pgVar7 = (this->super_llm_graph_context).ctx0;
      uVar15 = ggml_mul(pgVar7,pgVar20,
                        (this->model->layers).
                        super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar26].ssm_d,sVar30);
      uVar14 = ggml_add(pgVar7,uVar14,uVar15);
      pgVar7 = (this->super_llm_graph_context).ctx0;
      uVar15 = ggml_cont(pgVar7,uVar18);
      uVar15 = ggml_silu(pgVar7,uVar15);
      pgVar20 = (ggml_tensor *)ggml_mul(pgVar7,uVar14,uVar15);
      pgVar20 = llm_graph_context::build_lora_mm
                          (&this->super_llm_graph_context,
                           (this->model->layers).
                           super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar26].ssm_out,pgVar20);
      pgVar20 = (ggml_tensor *)
                ggml_reshape_2d((this->super_llm_graph_context).ctx0,pgVar20,pgVar20->ne[0],
                                (ulong)uVar3);
      return pgVar20;
    }
    pcVar25 = "ubatch.n_tokens == n_seq_tokens * n_seqs";
    uVar14 = 0x21e9;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
             ,uVar14,"GGML_ASSERT(%s) failed",pcVar25);
}

Assistant:

ggml_tensor * build_mamba_layer(
             ggml_cgraph * gf,
             ggml_tensor * cur,
             ggml_tensor * state_copy,
             ggml_tensor * state_mask,
      const llama_ubatch & ubatch,
                     int   il) const {
        const llama_kv_cache_unified * kv_self = static_cast<const llama_kv_cache_unified *>(memory);

        const auto kv_head = kv_self->head;

        const int64_t d_conv  = hparams.ssm_d_conv;
        const int64_t d_inner = hparams.ssm_d_inner;
        const int64_t d_state = hparams.ssm_d_state;
        const int64_t dt_rank = hparams.ssm_dt_rank;
        const int64_t n_seqs  = ubatch.n_seqs;
        // Some variants of Mamba arch (e.g. FalconMamba do apply layer norm on B and Dt layers)
        const bool ssm_dt_b_c_rms = hparams.ssm_dt_b_c_rms;
        // Use the same RMS norm as the final layer norm
        const float norm_rms_eps = hparams.f_norm_rms_eps;

        const int64_t n_seq_tokens = ubatch.n_seq_tokens;

        GGML_ASSERT(n_seqs != 0);
        GGML_ASSERT(ubatch.equal_seqs);
        GGML_ASSERT(ubatch.n_tokens == n_seq_tokens * n_seqs);

        ggml_tensor * conv_states_all = kv_self->k_l[il];
        ggml_tensor * ssm_states_all  = kv_self->v_l[il];

        // (ab)using the KV cache to store the states
        ggml_tensor * conv = build_copy_mask_state(
                gf, conv_states_all, state_copy, state_mask,
                hparams.n_embd_k_s(), n_seqs);
        conv = ggml_reshape_3d(ctx0, conv, d_conv - 1, d_inner, n_seqs);
        ggml_tensor * ssm = build_copy_mask_state(
                gf, ssm_states_all, state_copy, state_mask,
                hparams.n_embd_v_s(), n_seqs);
        ssm = ggml_reshape_3d(ctx0, ssm, d_state, d_inner, n_seqs);

        // {n_embd, n_tokens} => {n_embd, n_seq_tokens, n_seqs}
        cur = ggml_reshape_3d(ctx0, cur, cur->ne[0], n_seq_tokens, n_seqs);

        // {n_embd, 2*d_inner} @ {n_embd, n_seq_tokens, n_seqs} => {2*d_inner, n_seq_tokens, n_seqs}
        ggml_tensor * xz = build_lora_mm(model.layers[il].ssm_in, cur);
        // split the above in two
        // => {d_inner, n_seq_tokens, n_seqs}
        ggml_tensor * x = ggml_view_3d(ctx0, xz, d_inner, xz->ne[1], xz->ne[2], xz->nb[1], xz->nb[2], 0);
        ggml_tensor * z = ggml_view_3d(ctx0, xz, d_inner, xz->ne[1], xz->ne[2], xz->nb[1], xz->nb[2], d_inner*ggml_element_size(xz));

        // conv
        {
            // => {d_conv - 1 + n_seq_tokens, d_inner, n_seqs}
            ggml_tensor * conv_x = ggml_concat(ctx0, conv, ggml_transpose(ctx0, x), 0);

            // copy last (d_conv - 1) columns back into the state cache
            ggml_tensor * last_conv = ggml_view_3d(ctx0, conv_x, d_conv - 1, d_inner, n_seqs, conv_x->nb[1], conv_x->nb[2], n_seq_tokens*(conv_x->nb[0]));

            ggml_build_forward_expand(gf,
                ggml_cpy(ctx0, last_conv,
                    ggml_view_1d(ctx0, conv_states_all,
                        (d_conv - 1)*(d_inner)*(n_seqs),
                        kv_head*(d_conv - 1)*(d_inner)*ggml_element_size(conv_states_all))));

            // 1D convolution
            // The equivalent is to make a self-overlapping view of conv_x
            // over d_conv columns at each stride in the 3rd dimension,
            // then element-wise multiply that with the conv1d weight,
            // then sum the elements of each row,
            // (the last two steps are a dot product over rows (also doable with mul_mat))
            // then permute away the ne[0] dimension,
            // and then you're left with the resulting x tensor.
            // For simultaneous sequences, all sequences need to have the same length.
            x = ggml_ssm_conv(ctx0, conv_x, model.layers[il].ssm_conv1d);

            // bias
            x = ggml_add(ctx0, x, model.layers[il].ssm_conv1d_b);

            x = ggml_silu(ctx0, x);
        }

        // ssm
        {
            // {d_inner, dt_rank + 2*d_state} @ {d_inner, n_seq_tokens, n_seqs} => {dt_rank + 2*d_state, n_seq_tokens, n_seqs}
            ggml_tensor * x_db = build_lora_mm(model.layers[il].ssm_x, x);
            // split
            ggml_tensor * dt = ggml_view_3d(ctx0, x_db, dt_rank, n_seq_tokens, n_seqs, x_db->nb[1], x_db->nb[2], 0);
            ggml_tensor * B  = ggml_view_3d(ctx0, x_db, d_state, n_seq_tokens, n_seqs, x_db->nb[1], x_db->nb[2], ggml_element_size(x_db)*dt_rank);
            ggml_tensor * C  = ggml_view_3d(ctx0, x_db, d_state, n_seq_tokens, n_seqs, x_db->nb[1], x_db->nb[2], ggml_element_size(x_db)*(dt_rank+d_state));

            // Some Mamba variants (e.g. FalconMamba) apply RMS norm in B, C & Dt layers
            if (ssm_dt_b_c_rms) {
                dt = ggml_rms_norm(ctx0, dt, norm_rms_eps);
                B = ggml_rms_norm(ctx0, B, norm_rms_eps);
                C = ggml_rms_norm(ctx0, C, norm_rms_eps);
            }

            // {dt_rank, d_inner} @ {dt_rank, n_seq_tokens, n_seqs} => {d_inner, n_seq_tokens, n_seqs}
            dt = build_lora_mm(model.layers[il].ssm_dt, dt);
            dt = ggml_add(ctx0, dt, model.layers[il].ssm_dt_b);

            // Custom operator to optimize the parallel associative scan
            // as described in the Annex D of the Mamba paper.
            // => {d_inner, n_seq_tokens, n_seqs} and {d_state, d_inner, n_seqs}
            ggml_tensor * y_ssm = ggml_ssm_scan(ctx0, ssm, x, dt, model.layers[il].ssm_a, B, C);

            // store last states
            ggml_build_forward_expand(gf,
                ggml_cpy(ctx0,
                    ggml_view_1d(ctx0, y_ssm, d_state*d_inner*n_seqs, x->nb[3]),
                    ggml_view_1d(ctx0, ssm_states_all, d_state*d_inner*n_seqs, kv_head*d_state*d_inner*ggml_element_size(ssm_states_all))));

            ggml_tensor * y = ggml_view_3d(ctx0, y_ssm, d_inner, n_seq_tokens, n_seqs, x->nb[1], x->nb[2], 0);

            // TODO: skip computing output earlier for unused tokens

            // {d_inner, n_seq_tokens, n_seqs} * {d_inner} => {d_inner, n_seq_tokens, n_seqs}
            y = ggml_add(ctx0, y, ggml_mul(ctx0, x, model.layers[il].ssm_d));
            y = ggml_mul(ctx0, y, ggml_silu(ctx0, ggml_cont(ctx0, z)));

            // {d_inner, n_embd} @ {d_inner, n_seq_tokens, n_seqs} => {n_embd, n_seq_tokens, n_seqs}
            cur = build_lora_mm(model.layers[il].ssm_out, y);
        }

        // {n_embd, n_seq_tokens, n_seqs} => {n_embd, n_tokens}
        cur = ggml_reshape_2d(ctx0, cur, cur->ne[0], n_seq_tokens * n_seqs);
        //cb(cur, "mamba_out", il);

        return cur;
    }